

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

RangeStaticLayerParams * __thiscall
CoreML::Specification::RangeStaticLayerParams::New(RangeStaticLayerParams *this,Arena *arena)

{
  RangeStaticLayerParams *this_00;
  
  this_00 = (RangeStaticLayerParams *)operator_new(0x20);
  RangeStaticLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::RangeStaticLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

RangeStaticLayerParams* RangeStaticLayerParams::New(::google::protobuf::Arena* arena) const {
  RangeStaticLayerParams* n = new RangeStaticLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}